

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dense.cpp
# Opt level: O0

MatrixXd * __thiscall Dense::forward(Dense *this,MatrixXd *input)

{
  bool bVar1;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_00;
  Index in_RDX;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  MatrixBase<Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_>
  *in_stack_ffffffffffffff60;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
  *in_stack_ffffffffffffff68;
  
  __lhs = in_RDI;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_RDI,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_RDI);
  this_00 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(in_RSI + 0x20);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x149733);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::replicate
            (this_00,in_RDX,(Index)__lhs);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>>
  ::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)__lhs,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_>_>
              *)in_RDI);
  bVar1 = std::operator==(__lhs,(char *)in_RDI);
  if (bVar1) {
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::unaryExpr<double(*)(double)>
              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__lhs,
               (_func_double_double **)in_RDI);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
              ((Matrix<double,__1,__1,_0,__1,__1> *)__lhs,
               (DenseBase<Eigen::CwiseUnaryOp<double_(*)(double),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)in_RDI);
  }
  else {
    bVar1 = std::operator==(__lhs,(char *)in_RDI);
    if (bVar1) {
      Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::unaryExpr<double(*)(double)>
                ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__lhs,
                 (_func_double_double **)in_RDI);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
                ((Matrix<double,__1,__1,_0,__1,__1> *)__lhs,
                 (DenseBase<Eigen::CwiseUnaryOp<double_(*)(double),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)in_RDI);
    }
  }
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)__lhs,(Matrix<double,__1,__1,_0,__1,__1> *)in_RDI)
  ;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)__lhs,(Matrix<double,__1,__1,_0,__1,__1> *)in_RDI)
  ;
  return (MatrixXd *)__lhs;
}

Assistant:

Eigen::MatrixXd Dense::forward(Eigen::MatrixXd input) {
    activation = input*weigths + biases.replicate(input.rows(),1);;
    if(type == "tanh") {
        activation = activation.unaryExpr(&activation_functions::tanh_transfer);
    }
    else if(type == "sigmoid") {
        activation = activation.unaryExpr(&activation_functions::sigmoid_transfer);
    }
    last_input = input;
    return activation;
}